

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O1

int zueci_ksx1001_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  int iVar2;
  zueci_u32 zVar3;
  
  bVar1 = *src;
  zVar3 = (zueci_u32)bVar1;
  iVar2 = 1;
  if ((char)bVar1 < '\0') {
    if ((((bVar1 < 0xa1 || len < 2) || (bVar1 - 0xad < 3)) ||
        ((bVar1 - 0xc9 < 0x37 && ((0x60000000000001U >> ((ulong)(bVar1 - 0xc9) & 0x3f) & 1) != 0))))
       || (((byte)(src[1] + 1) < 0xa2 ||
           (zVar3 = (zueci_u32)
                    zueci_big5_mb_u
                    [(long)(int)(((uint)(bVar1 < 0xad) * 3 + zVar3 + -1 + (uint)(bVar1 < 0xca)) *
                                 0x5e + (uint)src[1]) + 0x16b7], zVar3 == 0)))) {
      return 0;
    }
    iVar2 = 2;
  }
  *p_u = zVar3;
  return iVar2;
}

Assistant:

static int zueci_ksx1001_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    unsigned char c1, c2;
    int ind;
    zueci_u32 u2;

    (void)flags;
    assert(len);

    c1 = src[0];
    if (c1 < 0x80) {
        *p_u = c1;
        return 1;
    }
    if (len < 2 || c1 < 0xA1 || (c1 > 0xAC && c1 < 0xB0) || c1 == 0xC9 || c1 > 0xFD) {
        return 0;
    }
    c2 = src[1];
    if (c2 < 0xA1 || c2 == 0xFF) {
        return 0;
    }
    ind = (0xFF - 0xA1) * (c1 - 0xA1 - (c1 > 0xAC) * 3 - (c1 > 0xC9)) + c2 - 0xA1;
    assert(ind < ZUECI_ASIZE(zueci_ksx1001_mb_u));
    if ((u2 = zueci_ksx1001_mb_u[ind])) {
        *p_u = u2;
        return 2;
    }
    return 0;
}